

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_expand_gz.c
# Opt level: O2

void test_expand_gz(void)

{
  wchar_t wVar1;
  wchar_t wVar2;
  
  extract_reference_file("test_expand.gz");
  wVar1 = systemf("%s %s >test.out 2>test.err",testprog,"test_expand.gz");
  if (wVar1 != L'\0') {
    wVar2 = canGzip();
    if (wVar2 == L'\0') {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cat/test/test_expand_gz.c"
                     ,L'(');
      test_skipping("It seems gzip is not supported on this platform");
      return;
    }
  }
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cat/test/test_expand_gz.c"
                      ,L'$',0,"0",(long)wVar1,"f",(void *)0x0);
  assertion_text_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cat/test/test_expand_gz.c"
             ,L'%',"contents of test_expand.gz.\n","test.out");
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cat/test/test_expand_gz.c"
             ,L'&',"test.err");
  return;
}

Assistant:

DEFINE_TEST(test_expand_gz)
{
	const char *reffile = "test_expand.gz";
	int f;

	extract_reference_file(reffile);
	f = systemf("%s %s >test.out 2>test.err", testprog, reffile);
	if (f == 0 || canGzip()) {
		assertEqualInt(0, f);
		assertTextFileContents("contents of test_expand.gz.\n", "test.out");
		assertEmptyFile("test.err");
	} else {
		skipping("It seems gzip is not supported on this platform");
	}
}